

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_96(QPDF *pdf,char *arg2)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  QPDFObjectHandle local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  QPDFObjectHandle local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  QPDFObjectHandle local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  QPDFObjectHandle s;
  char *arg2_local;
  QPDF *pdf_local;
  
  s.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  operator____qpdf(local_28,0x176a1b);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&local_48,"<043821385104>");
  if (!bVar1) {
    __assert_fail("s.unparseBinary() == \"<043821385104>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd60,"void test_96(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_48);
  operator____qpdf((char *)local_68,0x176a83);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,local_68);
  QPDFObjectHandle::~QPDFObjectHandle(local_68);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&local_88,"<043821385121>");
  if (!bVar1) {
    __assert_fail("s.unparseBinary() == \"<043821385121>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd62,"void test_96(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_88);
  operator____qpdf((char *)&local_98,0x176ac9);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,&local_98);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&local_b8,"<a0>");
  if (!bVar1) {
    __assert_fail("s.unparseBinary() == \"<a0>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd64,"void test_96(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_b8);
  operator____qpdf((char *)&local_c8,0x176aee);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_28,&local_c8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  bVar1 = std::operator==(&local_e8,"<abc0>");
  if (!bVar1) {
    __assert_fail("s.unparseBinary() == \"<abc0>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd66,"void test_96(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_e8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_96(QPDF& pdf, char const* arg2)
{
    // Test edge cases with quoted characters and string parsing.

    auto s = R"((\48\418\121\4))"_qpdf;
    assert(s.unparseBinary() == "<043821385104>");
    s = R"((\48\418\121\41))"_qpdf;
    assert(s.unparseBinary() == "<043821385121>");
    s = R"(<a>)"_qpdf;
    assert(s.unparseBinary() == "<a0>");
    s = R"(<abc>)"_qpdf;
    assert(s.unparseBinary() == "<abc0>");
}